

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall ui::anon_unknown_1::MainMenu::~MainMenu(MainMenu *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer piVar2;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__MainMenu_00174c78;
  p_Var1 = (this->resizeable_split_).
           super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->exit_button_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->group_tab_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->group_menu_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&this->tab_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&this->menu_);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->menu_entries_);
  piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  ftxui::ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

MainMenu(std::vector<Group> menu_group, ScreenInteractive* screen) {
    // The sub menu:
    index_.resize(menu_group.size());
    menu_entries_.resize(menu_group.size());
    menu_.resize(menu_group.size());
    tab_.resize(menu_group.size());

    MenuOption menu_option;
    menu_option.style_selected =
        bold | color(Color::Chartreuse1) | bgcolor(Color::Black);
    menu_option.style_focused =
        color(Color::Black) | bgcolor(Color::Chartreuse1);
    menu_option.style_selected_focused =
        bold | color(Color::Black) | bgcolor(Color::Chartreuse1);

    for (size_t i = 0; i < menu_group.size(); ++i) {
      menu_[i] = Menu(&menu_entries_[i], &index_[i], menu_option);
      tab_[i] = Container::Tab({}, &index_[i]);
      index_[i] = 0;
      for (auto it : menu_group[i].groups) {
        menu_entries_[i].push_back(it->Title());
        tab_[i]->Add(Make<PanelAdapter>(std::move(it)));
      }

      menu_[i] = Header(menu_group[i].title, menu_[i]);
    }

    // The global menu.
    group_menu_ = Container::Vertical(menu_, &group_index_);
    group_tab_ = Container::Tab(tab_, &group_index_);

    ButtonOption exitButtonOption;
    exitButtonOption.border = false;
    exit_button_ =
        Button("[Exit]", screen->ExitLoopClosure(), exitButtonOption);

    auto left_container = Container::Vertical({
        exit_button_,
        group_menu_,
    });

    auto menu_renderer = Renderer(left_container, [&] {
      return vbox({
          hbox({
              spinner(5, iteration_),
              text("  beagle-config"),
              filler(),
              exit_button_->Render() | color(Color::DarkOrange3),
          }),
          group_menu_->Render() | yframe,
      });
    });

    auto content_renderer =
        Renderer(group_tab_, [&] { return group_tab_->Render() | flex; });

    resizeable_split_ =
        ResizableSplitLeft(menu_renderer, content_renderer, &menu_width_);

    Add(resizeable_split_);
  }